

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

bool __thiscall BasicBlock::Contains(BasicBlock *this,Instr *instr)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  BasicBlock *blNext;
  long lVar6;
  Func **ppFVar7;
  long lVar8;
  Instr *pIVar9;
  Instr *pIVar10;
  bool bVar11;
  
  pBVar1 = this->next;
  ppFVar7 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar7 = &this->func;
  }
  lVar8 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar8 = 0xd0;
  }
  lVar6 = 0x18;
  if (*(long *)((long)&(*ppFVar7)->m_alloc + lVar8) == 0) {
    pIVar10 = (Instr *)0x0;
  }
  else {
    ppFVar7 = (Func **)&pBVar1->firstInstr;
    if (pBVar1 == (BasicBlock *)0x0) {
      lVar6 = 0xd0;
      ppFVar7 = &this->func;
    }
    pIVar10 = *(Instr **)(*(long *)((long)&(*ppFVar7)->m_alloc + lVar6) + 0x10);
  }
  pIVar9 = this->firstInstr;
  bVar11 = pIVar9 != pIVar10;
  if (bVar11) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pIVar5 = (Instr *)0x0;
    do {
      if ((pIVar5 != (Instr *)0x0) && (pIVar5->m_next != pIVar9)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xe7c,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == blockInstr)"
                           ,"Modifying instr list but not using EDITING iterator!");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      if (pIVar9 == instr) {
        return bVar11;
      }
      bVar11 = pIVar9->m_next != pIVar10;
      pIVar5 = pIVar9;
      pIVar9 = pIVar9->m_next;
    } while (bVar11);
  }
  return bVar11;
}

Assistant:

FOREACH_INSTR_IN_BLOCK(blockInstr, this)
    {
        if (instr == blockInstr)
        {
            return true;
        }
    }